

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O1

bool roll_em(MonsterThing *thatt,MonsterThing *thdef,ItemThing *weap,bool hurl)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int sides;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  int local_40;
  int local_3c;
  
  if (weap == (ItemThing *)0x0) {
    pcVar6 = (thatt->stats).s_dmg;
    iVar3 = 0;
    local_40 = 0;
  }
  else {
    iVar3 = weap->hplus;
    local_40 = weap->dplus;
    if (cur_weapon == weap) {
      if (cur_ring[0] != (ItemThing *)0x0) {
        if (cur_ring[0]->which == 8) {
          local_40 = local_40 + cur_ring[0]->arm;
        }
        else if ((cur_ring[0] != (ItemThing *)0x0) && (cur_ring[0]->which == 7)) {
          iVar3 = iVar3 + cur_ring[0]->arm;
        }
      }
      if (cur_ring[1] != (ItemThing *)0x0) {
        if (cur_ring[1]->which == 8) {
          local_40 = local_40 + cur_ring[1]->arm;
        }
        else if ((cur_ring[1] != (ItemThing *)0x0) && (cur_ring[1]->which == 7)) {
          iVar3 = iVar3 + cur_ring[1]->arm;
        }
      }
    }
    pcVar6 = weap->damage;
    if (hurl) {
      if (((cur_weapon == (ItemThing *)0x0) || ((weap->flags & 4U) == 0)) ||
         (cur_weapon->which != weap->launch)) {
        if (weap->launch < 0) {
          pcVar6 = weap->hurldmg;
        }
      }
      else {
        iVar3 = iVar3 + cur_weapon->hplus;
        local_40 = local_40 + cur_weapon->dplus;
        pcVar6 = weap->hurldmg;
      }
    }
  }
  local_3c = (thdef->stats).s_arm;
  if (thdef == &player) {
    if (cur_armor != (ItemThing *)0x0) {
      local_3c = cur_armor->arm;
    }
    if ((cur_ring[0] != (ItemThing *)0x0) && (cur_ring[0]->which == 0)) {
      local_3c = local_3c - cur_ring[0]->arm;
    }
    if ((cur_ring[1] != (ItemThing *)0x0) && (cur_ring[1]->which == 0)) {
      local_3c = local_3c - cur_ring[1]->arm;
    }
  }
  if (*pcVar6 == '\0') {
    bVar8 = false;
  }
  else {
    uVar2 = thdef->flags;
    bVar8 = false;
    while( true ) {
      iVar4 = atoi(pcVar6);
      pcVar6 = strchr(pcVar6,0x78);
      if (pcVar6 == (char *)0x0) break;
      sides = atoi(pcVar6 + 1);
      iVar5 = swing((thatt->stats).s_lvl,local_3c,
                    str_plus[(thatt->stats).s_str] + (~uVar2 >> 0xb & 4) + iVar3);
      if (iVar5 != 0) {
        iVar4 = roll(iVar4,sides);
        iVar4 = iVar4 + local_40 + add_dam[(thatt->stats).s_str];
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        piVar1 = &(thdef->stats).s_hpt;
        *piVar1 = *piVar1 - iVar4;
        bVar8 = true;
      }
      pcVar7 = strchr(pcVar6 + 1,0x2f);
      if (pcVar7 == (char *)0x0) {
        return bVar8;
      }
      pcVar6 = pcVar7 + 1;
      if (pcVar7[1] == '\0') {
        return bVar8;
      }
    }
  }
  return bVar8;
}

Assistant:

bool roll_em(MonsterThing *thatt, MonsterThing *thdef, ItemThing *weap, bool hurl)
{
    register struct stats *att, *def;
    register char *cp;
    register int ndice, nsides, def_arm;
    register bool did_hit = false;
    register int hplus;
    register int dplus;
    register int damage;

    att = &thatt->stats;
    def = &thdef->stats;
    if (weap == nullptr)
    {
        cp = att->s_dmg;
        dplus = 0;
        hplus = 0;
    }
    else
    {
        hplus = (weap == nullptr ? 0 : weap->hplus);
        dplus = (weap == nullptr ? 0 : weap->dplus);
        if (weap == cur_weapon)
        {
            if (ISRING(LEFT, R_ADDDAM))
                dplus += cur_ring[LEFT]->arm;
            else if (ISRING(LEFT, R_ADDHIT))
                hplus += cur_ring[LEFT]->arm;
            if (ISRING(RIGHT, R_ADDDAM))
                dplus += cur_ring[RIGHT]->arm;
            else if (ISRING(RIGHT, R_ADDHIT))
                hplus += cur_ring[RIGHT]->arm;
        }
        cp = weap->damage;
        if (hurl)
        {
            if ((weap->flags&ISMISL) && cur_weapon != nullptr && cur_weapon->which == weap->launch)
            {
                cp = weap->hurldmg;
                hplus += cur_weapon->hplus;
                dplus += cur_weapon->dplus;
            }
            else if (weap->launch < 0)
                cp = weap->hurldmg;
        }
    }
    /*
     * If the creature being attacked is not running (alseep or held)
     * then the attacker gets a plus four bonus to hit.
     */
    if (!on(*thdef, ISRUN))
        hplus += 4;
    def_arm = def->s_arm;
    if (def == &player.stats)
    {
        if (cur_armor != nullptr)
            def_arm = cur_armor->arm;
        if (ISRING(LEFT, R_PROTECT))
            def_arm -= cur_ring[LEFT]->arm;
        if (ISRING(RIGHT, R_PROTECT))
            def_arm -= cur_ring[RIGHT]->arm;
    }
    while(cp != nullptr && *cp != '\0')
    {
        ndice = atoi(cp);
        if ((cp = strchr(cp, 'x')) == nullptr)
            break;
        nsides = atoi(++cp);
        if (swing(att->s_lvl, def_arm, hplus + str_plus[att->s_str]))
        {
            int proll;

            proll = roll(ndice, nsides);
            damage = dplus + proll + add_dam[att->s_str];
            def->s_hpt -= max(0, damage);
            did_hit = true;
        }
        if ((cp = strchr(cp, '/')) == nullptr)
            break;
        cp++;
    }
    return did_hit;
}